

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O1

int ProgramMain(int argc,char **argv)

{
  long lVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  uint uVar4;
  uint uVar5;
  Result RVar6;
  Result RVar7;
  int iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  wabt *this;
  long *plVar10;
  size_t sVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data;
  long *plVar12;
  char *extraout_RDX;
  undefined1 *puVar13;
  size_type sVar14;
  uint uVar15;
  Module *out_module;
  uint uVar16;
  ulong uVar17;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view filename_02;
  string_view filename_03;
  string_view sVar32;
  string_view sVar33;
  size_type __dnew;
  string header_name_full;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  Errors errors;
  FileStream h_stream;
  OptionParser parser;
  ReadBinaryOptions options;
  _Any_data local_718;
  code *local_708;
  code *local_700;
  uint local_6d4;
  uint local_6d0;
  uint local_6cc;
  long *local_6c8;
  wabt *local_6c0;
  long local_6b8;
  long lStack_6b0;
  void *local_6a8;
  long lStack_6a0;
  long local_698;
  Errors local_688;
  long *local_668;
  undefined8 local_660;
  long local_658;
  undefined4 local_650;
  undefined1 local_64c;
  long *local_648;
  undefined8 local_640;
  long local_638;
  undefined1 local_630;
  code ***local_628;
  code **local_620;
  code **local_618 [2];
  long *local_608;
  undefined8 local_600;
  long local_5f8;
  undefined4 local_5f0;
  undefined1 local_5ec;
  undefined6 *local_5e8;
  undefined8 local_5e0;
  undefined6 local_5d8;
  undefined2 uStack_5d2;
  undefined6 uStack_5d0;
  undefined1 local_5ca;
  undefined2 *local_5c8;
  undefined8 local_5c0;
  undefined2 local_5b8;
  undefined1 uStack_5b6;
  undefined5 uStack_5b5;
  undefined5 *local_5a8;
  undefined8 local_5a0;
  undefined5 local_598;
  undefined3 uStack_593;
  undefined5 uStack_590;
  undefined1 local_58b;
  undefined7 *local_588;
  undefined8 local_580;
  undefined7 local_578;
  undefined4 uStack_571;
  undefined1 local_56d;
  undefined7 *local_568;
  undefined8 local_560;
  undefined7 local_558;
  undefined1 uStack_551;
  undefined7 uStack_550;
  undefined1 local_549;
  undefined7 *local_548;
  undefined8 local_540;
  undefined7 local_538;
  undefined4 uStack_531;
  undefined1 local_52d;
  long *local_528;
  undefined8 local_520;
  long local_518;
  undefined2 local_510;
  undefined7 *local_508;
  undefined8 local_500;
  undefined7 local_4f8;
  undefined4 uStack_4f1;
  undefined1 local_4ed;
  undefined4 *local_4e8;
  undefined8 local_4e0;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined4 *local_4c8;
  undefined8 local_4c0;
  undefined4 local_4b8;
  uint uStack_4b4;
  undefined6 *local_4a8;
  undefined8 local_4a0;
  undefined6 local_498;
  undefined2 uStack_492;
  undefined6 uStack_490;
  undefined1 local_48a;
  code ***local_488;
  code **local_480;
  code **local_478 [2];
  undefined7 *local_468;
  undefined8 local_460;
  undefined7 local_458;
  undefined1 uStack_451;
  undefined7 uStack_450;
  undefined1 local_449;
  long *local_448;
  undefined8 local_440;
  long local_438;
  undefined2 local_430;
  undefined1 local_42e;
  Stream *local_428 [2];
  undefined1 local_418 [16];
  undefined1 local_408 [24];
  code *local_3f0;
  undefined1 local_3c8 [92];
  Index IStack_36c;
  Index IStack_368;
  undefined8 uStack_364;
  undefined1 local_358 [16];
  pointer local_348;
  __node_base_ptr *local_250;
  size_type local_248;
  __node_base local_240;
  size_type sStack_238;
  float local_230;
  size_t local_228;
  __node_base_ptr p_Stack_220;
  __node_base_ptr *local_218;
  size_type local_210;
  __node_base local_208;
  size_type sStack_200;
  float local_1f8;
  size_t local_1f0;
  __node_base_ptr p_Stack_1e8;
  __node_base_ptr *local_1e0;
  size_type local_1d8;
  __node_base local_1d0;
  size_type sStack_1c8;
  float local_1c0;
  size_t local_1b8;
  __node_base_ptr p_Stack_1b0;
  __node_base_ptr *local_1a8;
  size_type local_1a0;
  __node_base local_198;
  size_type sStack_190;
  float local_188;
  size_t local_180;
  __node_base_ptr p_Stack_178;
  __node_base_ptr *local_170;
  size_type local_168;
  __node_base local_160;
  size_type sStack_158;
  float local_150;
  size_t local_148;
  __node_base_ptr p_Stack_140;
  __node_base_ptr *local_138;
  size_type local_130;
  __node_base local_128;
  size_type sStack_120;
  float local_118;
  size_t local_110;
  __node_base_ptr p_Stack_108;
  __node_base_ptr *local_100;
  size_type local_f8;
  __node_base local_f0;
  size_type sStack_e8;
  float local_e0;
  size_t local_d8;
  __node_base_ptr p_Stack_d0;
  __node_base_ptr *local_c8;
  size_type local_c0;
  __node_base local_b8;
  size_type sStack_b0;
  float local_a8;
  size_t local_a0;
  __node_base_ptr p_Stack_98;
  __node_base_ptr *local_90;
  size_type local_88;
  __node_base local_80;
  size_type sStack_78;
  float local_70;
  size_t local_68;
  __node_base_ptr p_Stack_60;
  ReadBinaryOptions local_58;
  size_type sVar18;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            ((OptionParser *)local_3c8,"wasm2c",
             "  Read a file in the WebAssembly binary format, and convert it to\n  a C source file and header.\n\nexamples:\n  # parse binary file test.wasm and write test.c and test.h\n  $ wasm2c test.wasm -o test.c\n\n  # parse test.wasm, write test.c and test.h, but ignore the debug names, if any\n  $ wasm2c test.wasm --no-debug-names -o test.c\n"
            );
  local_718._M_unused._M_object = (void *)0x0;
  local_718._8_8_ = 0;
  local_700 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:71:72)>
              ::_M_invoke;
  local_708 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:71:72)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3c8,'v',"verbose","Use multiple times for more info",
             (NullCallback *)&local_718);
  if (local_708 != (code *)0x0) {
    (*local_708)(&local_718,&local_718,3);
  }
  local_718._M_unused._M_object = (void *)0x0;
  local_718._8_8_ = 0;
  local_700 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:78:7)>
              ::_M_invoke;
  local_708 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:78:7)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3c8,'o',"output","FILENAME",
             "Output file for the generated C source file, by default use stdout",
             (Callback *)&local_718);
  if (local_708 != (code *)0x0) {
    (*local_708)(&local_718,&local_718,3);
  }
  local_718._M_unused._M_object = (void *)0x0;
  local_718._8_8_ = 0;
  local_700 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:88:7)>
              ::_M_invoke;
  local_708 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:88:7)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3c8,'n',"module-name","MODNAME",
             "Unique name for the module being generated. This name is prefixed to\neach of the generaed C symbols. By default, the module name from the\nnames section is used. If that is not present the name of the input\nfile is used as the default.\n"
             ,(Callback *)&local_718);
  if (local_708 != (code *)0x0) {
    (*local_708)(&local_718,&local_718,3);
  }
  wabt::Features::AddOptions(&s_features,(OptionParser *)local_3c8);
  local_718._M_unused._M_object = (void *)0x0;
  local_718._8_8_ = 0;
  local_700 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:91:20)>
              ::_M_invoke;
  local_708 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:91:20)>
              ::_M_manager;
  wabt::OptionParser::AddOption
            ((OptionParser *)local_3c8,"no-debug-names","Ignore debug names in the binary file",
             (NullCallback *)&local_718);
  if (local_708 != (code *)0x0) {
    (*local_708)(&local_718,&local_718,3);
  }
  local_708 = (code *)0x656d616e656c6966;
  local_718._8_8_ = 8;
  local_700 = (code *)((ulong)local_700 & 0xffffffffffffff00);
  local_408._0_8_ = (void *)0x0;
  local_408._8_8_ = 0;
  local_3f0 = std::
              _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:93:22)>
              ::_M_invoke;
  local_408._16_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/tools/wasm2c.cc:93:22)>
       ::_M_manager;
  local_718._M_unused._M_object = &local_708;
  wabt::OptionParser::AddArgument
            ((OptionParser *)local_3c8,(string *)&local_718,One,(Callback *)local_408);
  if ((_Manager_type)local_408._16_8_ != (_Manager_type)0x0) {
    (*(code *)local_408._16_8_)((_Any_data *)local_408,(_Any_data *)local_408,__destroy_functor);
  }
  if ((code **)local_718._M_unused._0_8_ != &local_708) {
    operator_delete(local_718._M_unused._M_object,(ulong)(local_708 + 1));
  }
  wabt::OptionParser::Parse((OptionParser *)local_3c8,argc,argv);
  bVar20 = s_features.exceptions_enabled_;
  bVar19 = false;
  if (s_features.exceptions_enabled_ == true) {
    local_438 = 0x6f69747065637865;
    local_430 = 0x736e;
    local_440 = 10;
    local_42e = 0;
    local_448 = &local_438;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names);
    bVar19 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
  }
  if ((bVar20 != false) && (local_448 != &local_438)) {
    operator_delete(local_448,local_438 + 1);
  }
  bVar20 = false;
  if (s_features.mutable_globals_enabled_ == false) {
    local_468 = &local_458;
    local_458 = 0x656c626174756d;
    uStack_451 = 0x2d;
    uStack_450 = 0x736c61626f6c67;
    local_460 = 0xf;
    local_449 = 0;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_468);
    bVar20 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
    if (local_468 != &local_458) {
      operator_delete(local_468,CONCAT17(uStack_451,local_458) + 1);
    }
  }
  bVar21 = false;
  if (s_features.sat_float_to_int_enabled_ == false) {
    local_488 = local_478;
    local_718._M_unused._M_member_pointer = 0x17;
    local_488 = (code ***)std::__cxx11::string::_M_create((ulong *)&local_488,(ulong)&local_718);
    local_478[0] = (code **)local_718._M_unused._0_8_;
    *(undefined4 *)local_488 = 0x75746173;
    builtin_strncpy((char *)((long)local_488 + 4),"rati",4);
    *(undefined4 *)(local_488 + 1) = 0x662d676e;
    builtin_strncpy((char *)((long)local_488 + 0xc),"loat",4);
    builtin_strncpy((char *)((long)local_488 + 0xf),"t-to-int",8);
    local_480 = (code **)local_718._M_unused._0_8_;
    *(char *)((long)local_488 + (long)local_718._M_unused._0_8_) = '\0';
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_488);
    bVar21 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
    if (local_488 != local_478) {
      operator_delete(local_488,(long)local_478[0] + 1);
    }
  }
  uVar16 = 0;
  if (s_features.sign_extension_enabled_ == false) {
    local_4a8 = &local_498;
    local_498 = 0x652d6e676973;
    uStack_492 = 0x7478;
    uStack_490 = 0x6e6f69736e65;
    local_4a0 = 0xe;
    local_48a = 0;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4a8);
    uVar16 = (uint)(pbVar9 ==
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &s_read_debug_names);
    if (local_4a8 != &local_498) {
      operator_delete(local_4a8,CONCAT26(uStack_492,local_498) + 1);
    }
  }
  bVar22 = false;
  if (s_features.simd_enabled_ == false) {
    local_4c8 = &local_4b8;
    local_4b8 = 0x646d6973;
    local_4c0 = 4;
    uStack_4b4 = uStack_4b4 & 0xffffff00;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_4c8);
    bVar22 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
    if (local_4c8 != &local_4b8) {
      operator_delete(local_4c8,CONCAT44(uStack_4b4,local_4b8) + 1);
    }
  }
  bVar23 = s_features.threads_enabled_;
  local_6d0 = 0;
  local_6cc = uVar16;
  if (s_features.threads_enabled_ == true) {
    local_4d8 = 0x65726874;
    local_4e0 = 7;
    uStack_4d4 = 0x736461;
    local_4e8 = &local_4d8;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names);
    local_6d0 = (uint)(pbVar9 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &s_read_debug_names);
  }
  if ((bVar23 != false) && (local_4e8 != &local_4d8)) {
    operator_delete(local_4e8,CONCAT44(uStack_4d4,local_4d8) + 1);
  }
  bVar24 = s_features.function_references_enabled_;
  bVar23 = false;
  if (s_features.function_references_enabled_ == true) {
    local_718._M_unused._M_member_pointer = 0x13;
    local_628 = local_618;
    local_628 = (code ***)std::__cxx11::string::_M_create((ulong *)&local_628,(ulong)&local_718);
    local_618[0] = (code **)local_718._M_unused._0_8_;
    *(undefined4 *)local_628 = 0x636e7566;
    builtin_strncpy((char *)((long)local_628 + 4),"tion",4);
    *(undefined4 *)(local_628 + 1) = 0x6665722d;
    builtin_strncpy((char *)((long)local_628 + 0xc),"eren",4);
    builtin_strncpy((char *)((long)local_628 + 0xf),"nces",4);
    local_620 = (code **)local_718._M_unused._0_8_;
    *(char *)((long)local_628 + (long)local_718._M_unused._0_8_) = '\0';
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_628);
    bVar23 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
  }
  if ((bVar24 != false) && (local_628 != local_618)) {
    operator_delete(local_628,(long)local_618[0] + 1);
  }
  local_6d4 = 0;
  if (s_features.multi_value_enabled_ == false) {
    local_508 = &local_4f8;
    local_4f8 = 0x762d69746c756d;
    uStack_4f1 = 0x65756c61;
    local_500 = 0xb;
    local_4ed = 0;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_508);
    local_6d4 = (uint)(pbVar9 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &s_read_debug_names);
    if (local_508 != &local_4f8) {
      operator_delete(local_508,CONCAT17((undefined1)uStack_4f1,local_4f8) + 1);
    }
  }
  bVar25 = s_features.tail_call_enabled_;
  bVar24 = false;
  if (s_features.tail_call_enabled_ == true) {
    local_518 = 0x6c61632d6c696174;
    local_510 = 0x6c;
    local_520 = 9;
    local_528 = &local_518;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names);
    bVar24 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
  }
  if ((bVar25 != false) && (local_528 != &local_518)) {
    operator_delete(local_528,local_518 + 1);
  }
  bVar25 = false;
  uVar16 = local_6cc;
  if (s_features.bulk_memory_enabled_ == false) {
    local_548 = &local_538;
    local_538 = 0x656d2d6b6c7562;
    uStack_531 = 0x79726f6d;
    local_540 = 0xb;
    local_52d = 0;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_548);
    uVar16 = local_6cc;
    bVar25 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
    if (local_548 != &local_538) {
      operator_delete(local_548,CONCAT17((undefined1)uStack_531,local_538) + 1);
    }
  }
  bVar26 = false;
  if (s_features.reference_types_enabled_ == false) {
    local_568 = &local_558;
    local_558 = 0x6e657265666572;
    uStack_551 = 99;
    uStack_550 = 0x73657079742d65;
    local_560 = 0xf;
    local_549 = 0;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names,&local_568);
    bVar26 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
    if (local_568 != &local_558) {
      operator_delete(local_568,CONCAT17(uStack_551,local_558) + 1);
    }
  }
  bVar28 = s_features.annotations_enabled_;
  bVar27 = false;
  if (s_features.annotations_enabled_ == true) {
    local_578 = 0x7461746f6e6e61;
    uStack_571 = 0x736e6f69;
    local_580 = 0xb;
    local_56d = 0;
    local_588 = &local_578;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names);
    bVar27 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
  }
  uVar5 = local_6d0;
  if ((bVar28 != false) && (local_588 != &local_578)) {
    operator_delete(local_588,CONCAT17((undefined1)uStack_571,local_578) + 1);
  }
  bVar28 = s_features.code_metadata_enabled_;
  uVar15 = 0;
  if (s_features.code_metadata_enabled_ == true) {
    local_598 = 0x2d65646f63;
    uStack_593 = 0x74656d;
    uStack_590 = 0x6174616461;
    local_5a0 = 0xd;
    local_58b = 0;
    local_5a8 = &local_598;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names);
    uVar15 = (uint)(pbVar9 ==
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &s_read_debug_names);
  }
  uVar4 = local_6d4;
  if ((bVar28 != false) && (local_5a8 != &local_598)) {
    operator_delete(local_5a8,CONCAT35(uStack_593,local_598) + 1);
  }
  bVar29 = s_features.gc_enabled_;
  bVar28 = false;
  if (s_features.gc_enabled_ == true) {
    local_5b8 = 0x6367;
    local_5c0 = 2;
    uStack_5b6 = 0;
    local_5c8 = &local_5b8;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names);
    bVar28 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
  }
  if ((bVar29 != false) && (local_5c8 != &local_5b8)) {
    operator_delete(local_5c8,CONCAT53(uStack_5b5,CONCAT12(uStack_5b6,local_5b8)) + 1);
  }
  bVar30 = s_features.memory64_enabled_;
  bVar29 = false;
  if (s_features.memory64_enabled_ == true) {
    local_638 = 0x343679726f6d656d;
    local_640 = 8;
    local_630 = 0;
    local_648 = &local_638;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names);
    bVar29 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
  }
  puVar13 = (undefined1 *)(ulong)uVar15;
  if ((bVar30 != false) && (local_648 != &local_638)) {
    operator_delete(local_648,local_638 + 1);
  }
  bVar31 = s_features.multi_memory_enabled_;
  bVar30 = false;
  if (s_features.multi_memory_enabled_ == true) {
    local_658 = 0x656d2d69746c756d;
    local_650 = 0x79726f6d;
    local_660 = 0xc;
    local_64c = 0;
    puVar13 = &s_read_debug_names;
    local_668 = &local_658;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names);
    bVar30 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
  }
  if ((bVar31 != false) && (local_668 != &local_658)) {
    operator_delete(local_668,local_658 + 1);
  }
  bVar2 = s_features.extended_const_enabled_;
  bVar31 = false;
  if (s_features.extended_const_enabled_ == true) {
    local_5d8 = 0x646e65747865;
    uStack_5d2 = 0x6465;
    uStack_5d0 = 0x74736e6f632d;
    local_5e0 = 0xe;
    local_5ca = 0;
    puVar13 = &s_read_debug_names;
    local_5e8 = &local_5d8;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names);
    bVar31 = pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &s_read_debug_names;
  }
  if ((bVar2 != false) && (local_5e8 != &local_5d8)) {
    operator_delete(local_5e8,CONCAT26(uStack_5d2,local_5d8) + 1);
  }
  bVar2 = s_features.relaxed_simd_enabled_;
  uVar17 = CONCAT71((int7)((ulong)&local_5d8 >> 8),s_features.relaxed_simd_enabled_);
  out_data = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  if (s_features.relaxed_simd_enabled_ == true) {
    local_5f8 = 0x2d646578616c6572;
    local_5f0 = 0x646d6973;
    local_600 = 0xc;
    local_5ec = 0;
    puVar13 = &s_read_debug_names;
    local_608 = &local_5f8;
    pbVar9 = std::
             __find_if<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (supported_features_abi_cxx11_,&s_read_debug_names);
    out_data = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               (ulong)(pbVar9 ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &s_read_debug_names);
  }
  iVar8 = (int)out_data;
  if ((bVar2 != false) && (local_608 != &local_5f8)) {
    operator_delete(local_608,local_5f8 + 1);
  }
  if ((bVar31 ||
      (((((bVar27 ||
          (((((bVar23 || (((((bVar20 || bVar19) || bVar21) || uVar16 != 0) || bVar22) || uVar5 != 0)
              ) || uVar4 != 0) || bVar24) || bVar25) || bVar26)) || uVar15 != 0) || bVar28) ||
       bVar29) || bVar30)) || iVar8 != 0) {
    ProgramMain();
LAB_001162b6:
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar17
               ,puVar13);
  }
  if (local_348 != (pointer)0x0) {
    (*(code *)local_348)(local_358,local_358,3);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            ((vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_> *)
             (local_3c8 + 0x58));
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            ((vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_> *)
             (local_3c8 + 0x40));
  if ((undefined1 *)local_3c8._32_8_ != local_3c8 + 0x30) {
    operator_delete((void *)local_3c8._32_8_,CONCAT71(local_3c8._49_7_,local_3c8[0x30]) + 1);
  }
  if ((undefined1 *)local_3c8._0_8_ != local_3c8 + 0x10) {
    operator_delete((void *)local_3c8._0_8_,CONCAT44(local_3c8._20_4_,local_3c8._16_4_) + 1);
  }
  _Var3._M_p = s_infile_abi_cxx11_._M_dataplus._M_p;
  local_6a8 = (void *)0x0;
  lStack_6a0 = 0;
  local_698 = 0;
  this = (wabt *)strlen(s_infile_abi_cxx11_._M_dataplus._M_p);
  sVar32._M_str = (char *)&local_6a8;
  sVar32._M_len = (size_t)_Var3._M_p;
  RVar6 = wabt::ReadFile(this,sVar32,out_data);
  uVar16 = 1;
  if (RVar6.enum_ == Ok) {
    local_688.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_688.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_688.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3c8._16_4_ = 0;
    local_3c8._20_4_ = 0;
    local_3c8._24_4_ = 0;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_4_ = 0;
    local_3c8._12_4_ = 0;
    local_3c8._40_8_ = 0;
    local_3c8[0x30] = '\0';
    local_3c8._64_8_ = (pointer)0x0;
    local_3c8._72_8_ = (pointer)0x0;
    local_3c8._80_8_ = (pointer)0x0;
    local_3c8._88_4_ = 0;
    IStack_36c = 0;
    IStack_368 = 0;
    uStack_364 = 0;
    local_3c8._32_8_ = local_3c8 + 0x30;
    memset(local_358,0,0x108);
    local_248 = 1;
    local_240._M_nxt = (_Hash_node_base *)0x0;
    sStack_238 = 0;
    local_230 = 1.0;
    local_228 = 0;
    p_Stack_220 = (__node_base_ptr)0x0;
    local_218 = &p_Stack_1e8;
    local_210 = 1;
    local_208._M_nxt = (_Hash_node_base *)0x0;
    sStack_200 = 0;
    local_1f8 = 1.0;
    local_1f0 = 0;
    p_Stack_1e8 = (__node_base_ptr)0x0;
    local_1e0 = &p_Stack_1b0;
    local_1d8 = 1;
    local_1d0._M_nxt = (_Hash_node_base *)0x0;
    sStack_1c8 = 0;
    local_1c0 = 1.0;
    local_1b8 = 0;
    p_Stack_1b0 = (__node_base_ptr)0x0;
    local_1a8 = &p_Stack_178;
    local_1a0 = 1;
    local_198._M_nxt = (_Hash_node_base *)0x0;
    sStack_190 = 0;
    local_188 = 1.0;
    local_180 = 0;
    p_Stack_178 = (__node_base_ptr)0x0;
    local_170 = &p_Stack_140;
    local_168 = 1;
    local_160._M_nxt = (_Hash_node_base *)0x0;
    sStack_158 = 0;
    local_150 = 1.0;
    local_148 = 0;
    p_Stack_140 = (__node_base_ptr)0x0;
    local_138 = &p_Stack_108;
    local_130 = 1;
    local_128._M_nxt = (_Hash_node_base *)0x0;
    sStack_120 = 0;
    local_118 = 1.0;
    local_110 = 0;
    p_Stack_108 = (__node_base_ptr)0x0;
    local_100 = &p_Stack_d0;
    local_f8 = 1;
    local_f0._M_nxt = (_Hash_node_base *)0x0;
    sStack_e8 = 0;
    local_e0 = 1.0;
    local_d8 = 0;
    p_Stack_d0 = (__node_base_ptr)0x0;
    local_c8 = &p_Stack_98;
    local_c0 = 1;
    local_b8._M_nxt = (_Hash_node_base *)0x0;
    sStack_b0 = 0;
    local_a8 = 1.0;
    local_a0 = 0;
    p_Stack_98 = (__node_base_ptr)0x0;
    local_90 = &p_Stack_60;
    local_88 = 1;
    local_80._M_nxt = (_Hash_node_base *)0x0;
    sStack_78 = 0;
    local_70 = 1.0;
    local_68 = 0;
    p_Stack_60 = (__node_base_ptr)0x0;
    local_58.read_debug_names = (bool)(s_read_debug_names ^ 1);
    local_58.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    local_58.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    local_58.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_;
    local_58.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    local_58.features.simd_enabled_ = s_features.simd_enabled_;
    local_58.features.threads_enabled_ = s_features.threads_enabled_;
    local_58.features.function_references_enabled_ = s_features.function_references_enabled_;
    local_58.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    local_58.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    local_58.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    local_58.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    local_58.features.annotations_enabled_ = s_features.annotations_enabled_;
    local_58.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
    local_58.features.gc_enabled_ = s_features.gc_enabled_;
    local_58.features.memory64_enabled_ = s_features.memory64_enabled_;
    local_58.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
    local_58.features.extended_const_enabled_ = s_features.extended_const_enabled_;
    local_58.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
    local_58.log_stream =
         (Stream *)
         s_log_stream._M_t.
         super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
         super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
         super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl;
    local_58.stop_on_first_error = true;
    local_58.fail_on_custom_section_error = true;
    local_58.skip_function_bodies = false;
    out_module = (Module *)local_3c8;
    local_250 = &p_Stack_220;
    RVar6 = wabt::ReadBinaryIr(s_infile_abi_cxx11_._M_dataplus._M_p,local_6a8,
                               lStack_6a0 - (long)local_6a8,&local_58,&local_688,out_module);
    if (RVar6.enum_ == Ok) {
      local_708 = (code *)CONCAT62(local_708._2_6_,s_features._16_2_);
      local_718._M_unused._M_member_pointer =
           CONCAT17(s_features.multi_value_enabled_,
                    CONCAT16(s_features.function_references_enabled_,
                             CONCAT15(s_features.threads_enabled_,
                                      CONCAT14(s_features.simd_enabled_,
                                               CONCAT13(s_features.sign_extension_enabled_,
                                                        CONCAT12(s_features.
                                                                 sat_float_to_int_enabled_,
                                                                 CONCAT11(s_features.
                                                                          mutable_globals_enabled_,
                                                                          s_features.
                                                                          exceptions_enabled_)))))))
      ;
      local_718._8_8_ =
           CONCAT17(s_features.multi_memory_enabled_,
                    CONCAT16(s_features.memory64_enabled_,
                             CONCAT15(s_features.gc_enabled_,
                                      CONCAT14(s_features.code_metadata_enabled_,
                                               CONCAT13(s_features.annotations_enabled_,
                                                        CONCAT12(s_features.reference_types_enabled_
                                                                 ,CONCAT11(s_features.
                                                                           bulk_memory_enabled_,
                                                                           s_features.
                                                                           tail_call_enabled_)))))))
      ;
      RVar6 = wabt::ValidateModule((Module *)local_3c8,&local_688,(ValidateOptions *)&local_718);
      RVar7 = wabt::GenerateNames((Module *)local_3c8,None);
      if (RVar7.enum_ == Error || RVar6.enum_ == Error) {
        RVar6.enum_ = (Enum)(RVar7.enum_ == Error || RVar6.enum_ == Error);
      }
      else {
        wabt::ApplyNames((Module *)local_3c8);
        sVar14 = s_outfile_abi_cxx11_._M_string_length;
        _Var3 = s_outfile_abi_cxx11_._M_dataplus;
        sVar18 = s_outfile_abi_cxx11_._M_string_length;
        if (s_outfile_abi_cxx11_._M_string_length == 0) {
          wabt::FileStream::FileStream((FileStream *)&local_718,_stdout,(Stream *)0x0);
          RVar6 = wabt::WriteC((wabt *)local_718._M_pod_data,(Stream *)&local_718,(Stream *)"wasm.h"
                               ,local_3c8,(Module *)&s_write_c_options,(WriteCOptions *)out_module);
          wabt::FileStream::~FileStream((FileStream *)&local_718);
        }
        else {
          do {
            uVar17 = sVar18 - 1;
            if (sVar18 == 0) {
              uVar17 = 0xffffffffffffffff;
              break;
            }
            lVar1 = sVar18 - 1;
            sVar18 = uVar17;
          } while (s_outfile_abi_cxx11_._M_dataplus._M_p[lVar1] != '.');
          puVar13 = (undefined1 *)s_outfile_abi_cxx11_._M_string_length;
          if (s_outfile_abi_cxx11_._M_string_length < uVar17) goto LAB_001162b6;
          if ((s_outfile_abi_cxx11_._M_string_length - uVar17 == 2) &&
             (iVar8 = bcmp(s_outfile_abi_cxx11_._M_dataplus._M_p + uVar17,".c",2), iVar8 == 0)) {
            sVar14 = uVar17;
          }
          local_718._M_unused._M_object = &local_708;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_718,_Var3._M_p,_Var3._M_p + sVar14);
          plVar10 = (long *)std::__cxx11::string::append(local_718._M_pod_data);
          plVar12 = plVar10 + 2;
          if ((long *)*plVar10 == plVar12) {
            local_6b8 = *plVar12;
            lStack_6b0 = plVar10[3];
            local_6c8 = &local_6b8;
          }
          else {
            local_6b8 = *plVar12;
            local_6c8 = (long *)*plVar10;
          }
          local_6c0 = (wabt *)plVar10[1];
          *plVar10 = (long)plVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          if ((code **)local_718._M_unused._0_8_ != &local_708) {
            operator_delete(local_718._M_unused._M_object,(ulong)(local_708 + 1));
          }
          _Var3._M_p = s_outfile_abi_cxx11_._M_dataplus._M_p;
          sVar11 = strlen(s_outfile_abi_cxx11_._M_dataplus._M_p);
          filename._M_str = _Var3._M_p;
          filename._M_len = sVar11;
          wabt::FileStream::FileStream((FileStream *)&local_718,filename,(Stream *)0x0);
          filename_00._M_str = (char *)local_6c8;
          filename_00._M_len = (size_t)local_6c0;
          wabt::FileStream::FileStream((FileStream *)local_408,filename_00,(Stream *)0x0);
          filename_01._M_str = extraout_RDX;
          filename_01._M_len = (size_t)local_6c8;
          sVar32 = wabt::GetBasename(local_6c0,filename_01);
          sVar33._M_str = s_write_c_options.module_name._M_str;
          sVar33._M_len = s_write_c_options.module_name._M_len;
          filename_02._M_str = sVar32._M_str;
          if (s_write_c_options.module_name._M_len == 0) {
            s_write_c_options.module_name._M_len = local_3c8._40_8_;
            s_write_c_options.module_name._M_str = (char *)local_3c8._32_8_;
            sVar33._M_str = (char *)local_3c8._32_8_;
            sVar33._M_len = local_3c8._40_8_;
            if (local_3c8._40_8_ == 0) {
              filename_02._M_len = (size_t)s_infile_abi_cxx11_._M_dataplus._M_p;
              sVar33 = wabt::GetBasename((wabt *)s_infile_abi_cxx11_._M_string_length,filename_02);
              filename_03._M_str = sVar33._M_str;
              filename_03._M_len = (size_t)filename_03._M_str;
              sVar33 = wabt::StripExtension((wabt *)sVar33._M_len,filename_03);
            }
          }
          local_428[0] = (Stream *)local_418;
          s_write_c_options.module_name = sVar33;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_428,filename_02._M_str,filename_02._M_str + sVar32._M_len);
          RVar6 = wabt::WriteC((wabt *)local_718._M_pod_data,(Stream *)local_408,local_428[0],
                               local_3c8,(Module *)&s_write_c_options,(WriteCOptions *)out_module);
          if (local_428[0] != (Stream *)local_418) {
            operator_delete(local_428[0],local_418._0_8_ + 1);
          }
          wabt::FileStream::~FileStream((FileStream *)local_408);
          wabt::FileStream::~FileStream((FileStream *)&local_718);
          if (local_6c8 != &local_6b8) {
            operator_delete(local_6c8,local_6b8 + 1);
          }
        }
      }
    }
    local_718._8_8_ = 0;
    local_708 = (code *)((ulong)local_708 & 0xffffffffffffff00);
    local_718._M_unused._M_object = &local_708;
    wabt::FormatErrorsToFile
              (&local_688,Binary,(LexerSourceLineFinder *)0x0,_stderr,(string *)&local_718,Never,
               0x50);
    if ((code **)local_718._M_unused._0_8_ != &local_708) {
      operator_delete(local_718._M_unused._M_object,(ulong)(local_708 + 1));
    }
    wabt::Module::~Module((Module *)local_3c8);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&local_688);
    uVar16 = (uint)(RVar6.enum_ != Ok);
  }
  if (local_6a8 != (void *)0x0) {
    operator_delete(local_6a8,local_698 - (long)local_6a8);
  }
  return uVar16;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  result = ReadFile(s_infile.c_str(), &file_data);
  if (Succeeded(result)) {
    Errors errors;
    Module module;
    const bool kStopOnFirstError = true;
    const bool kFailOnCustomSectionError = true;
    ReadBinaryOptions options(s_features, s_log_stream.get(),
                              s_read_debug_names, kStopOnFirstError,
                              kFailOnCustomSectionError);
    result = ReadBinaryIr(s_infile.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module);
    if (Succeeded(result)) {
      if (Succeeded(result)) {
        ValidateOptions options(s_features);
        result = ValidateModule(&module, &errors, options);
        result |= GenerateNames(&module);
      }

      if (Succeeded(result)) {
        /* TODO(binji): This shouldn't fail; if a name can't be applied
         * (because the index is invalid, say) it should just be skipped. */
        Result dummy_result = ApplyNames(&module);
        WABT_USE(dummy_result);
      }

      if (Succeeded(result)) {
        if (!s_outfile.empty()) {
          std::string header_name_full =
              std::string(strip_extension(s_outfile)) + ".h";
          FileStream c_stream(s_outfile.c_str());
          FileStream h_stream(header_name_full);
          std::string_view header_name = GetBasename(header_name_full);
          if (s_write_c_options.module_name.empty()) {
            s_write_c_options.module_name = module.name;
            if (s_write_c_options.module_name.empty()) {
              // In the absence of module name in the names section use the
              // filename.
              s_write_c_options.module_name =
                  StripExtension(GetBasename(s_infile));
            }
          }
          result =
              WriteC(&c_stream, &h_stream, std::string(header_name).c_str(),
                     &module, s_write_c_options);
        } else {
          FileStream stream(stdout);
          result =
              WriteC(&stream, &stream, "wasm.h", &module, s_write_c_options);
        }
      }
    }
    FormatErrorsToFile(errors, Location::Type::Binary);
  }
  return result != Result::Ok;
}